

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> file;
  fitting_result result;
  string local_a8;
  fitting_settings settings;
  
  settings.brdf_method._M_dataplus._M_p = (pointer)&settings.brdf_method.field_2;
  settings.run_mode = normal;
  settings.brdf_method._M_string_length = 0;
  settings.brdf_method.field_2._M_local_buf[0] = '\0';
  settings.output_file._M_dataplus._M_p = (pointer)&settings.output_file.field_2;
  settings.output_file._M_string_length = 0;
  settings.output_file.field_2._M_local_buf[0] = '\0';
  settings.input_file._M_dataplus._M_p = (pointer)&settings.input_file.field_2;
  settings.input_file._M_string_length = 0;
  settings.input_file.field_2._M_local_buf[0] = '\0';
  bVar1 = get_fitting_settings_from_command_line(&settings,argc,argv);
  if (bVar1) {
    iVar3 = 0;
    if (settings.run_mode != exit) {
      if (settings.run_mode == preview_input) {
        std::__cxx11::string::string((string *)&local_a8,(string *)&settings.input_file);
        create_preview_for_file(&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        iVar3 = 0;
      }
      else if (settings.run_mode == test) {
        run_tests();
      }
      else {
        print_fitting_settings(&settings);
        build_lookup(&result,&settings);
        make_alf_file((fitting_result *)&file);
        alf::write_alf_file((alf_file *)
                            file._M_t.
                            super___uniq_ptr_impl<alf::alf_file,_std::default_delete<alf::alf_file>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_alf::alf_file_*,_std::default_delete<alf::alf_file>_>
                            .super__Head_base<0UL,_alf::alf_file_*,_false>._M_head_impl,
                            &settings.output_file);
        std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::~unique_ptr(&file);
        std::_Vector_base<ltc_store_data,_std::allocator<ltc_store_data>_>::~_Vector_base
                  (&result.transformations.
                    super__Vector_base<ltc_store_data,_std::allocator<ltc_store_data>_>);
        iVar3 = 0;
      }
    }
  }
  else {
    poVar2 = log_error();
    poVar2 = std::operator<<(poVar2,"Failed to set fitting settings, aborting...");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar3 = 1;
  }
  fitting_settings::~fitting_settings(&settings);
  return iVar3;
}

Assistant:

int main(int argc, const char *argv[])
{
  try
  {
    fitting_settings settings;
    if (!get_fitting_settings_from_command_line(settings, argc, argv))
    {
      log_error() << "Failed to set fitting settings, aborting..." << std::endl;
      return EXIT_FAILURE;
    }

    if (settings.run_mode == run_mode::exit) {
      return EXIT_SUCCESS;
    }
    else if (settings.run_mode == run_mode::test) {
      run_tests();
      return EXIT_SUCCESS;
    } else if (settings.run_mode == run_mode::preview_input) {
      create_preview_for_file(settings.input_file);
      return EXIT_SUCCESS;
    }

    print_fitting_settings(settings);
    auto result = build_lookup(settings);

    auto file = make_alf_file(result);
    alf::write_alf_file(*file, settings.output_file);
  }
  catch (std::exception &exc)
  {
    log_error() << "Exception: " << exc.what() << std::endl;
    return EXIT_FAILURE;
  }
  catch (...)
  {
    log_error() << "Unknown exception has been thrown. Aborting." << std::endl;
    return EXIT_FAILURE;
  }

  return EXIT_SUCCESS;
}